

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

base_learner * kernel_svm_setup(options_i *options,vw *all)

{
  byte bVar1;
  int iVar2;
  vw *pvVar3;
  option_group_definition *funcName;
  loss_function *plVar4;
  svm_model *psVar5;
  pointer psVar6;
  svm_example **ppsVar7;
  ostream *poVar8;
  void *pvVar9;
  double *pdVar10;
  learner<svm_params,_example> *this;
  vw *in_RSI;
  long *in_RDI;
  __type_conflict _Var11;
  learner<svm_params,_example> *l;
  float loss_parameter;
  string loss_function;
  option_group_definition new_options;
  bool ksvm;
  int degree;
  float bandwidth;
  string kernel_type;
  free_ptr<svm_params> params;
  undefined4 in_stack_fffffffffffff3b8;
  uint32_t in_stack_fffffffffffff3bc;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff3c0;
  string *in_stack_fffffffffffff3c8;
  undefined4 in_stack_fffffffffffff3d0;
  int in_stack_fffffffffffff3d4;
  _func_void_svm_params_ptr *in_stack_fffffffffffff3d8;
  learner<svm_params,_example> *in_stack_fffffffffffff3e0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff408;
  option_group_definition *in_stack_fffffffffffff410;
  byte local_ba2;
  allocator *paVar12;
  float fVar13;
  allocator local_9c9;
  string local_9c8 [32];
  string local_9a8 [32];
  undefined4 local_988;
  allocator local_981;
  string local_980 [32];
  undefined4 local_960;
  allocator local_959;
  string local_958 [39];
  allocator local_931;
  string local_930 [32];
  typed_option<int> local_910;
  allocator local_869;
  string local_868 [39];
  allocator local_841;
  string local_840 [32];
  typed_option<float> local_820;
  allocator local_779;
  string local_778 [39];
  allocator local_751;
  string local_750 [39];
  allocator local_729;
  string local_728 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_708;
  allocator local_661;
  string local_660 [39];
  allocator local_639;
  string local_638 [199];
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [199];
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [199];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [199];
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [199];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [32];
  typed_option<bool> local_168;
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [63];
  byte local_51;
  int local_50;
  float local_4c;
  string local_48 [48];
  vw *local_18;
  long *local_10;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<svm_params>();
  std::__cxx11::string::string(local_48);
  local_4c = 1.0;
  local_50 = 2;
  local_51 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Kernel SVM",&local_b1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff3c0,
             (string *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"ksvm",&local_189);
  VW::config::make_option<bool>(in_stack_fffffffffffff3c8,(bool *)in_stack_fffffffffffff3c0);
  VW::config::typed_option<bool>::keep(&local_168,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"kernel svm",&local_1b1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff3c0,
             (string *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff410,(typed_option<bool> *)in_stack_fffffffffffff408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"reprocess",&local_279);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
            ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39cf22);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff3c8,(unsigned_long *)in_stack_fffffffffffff3c0);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
             (unsigned_long)in_stack_fffffffffffff3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"number of reprocess steps for LASVM",&local_2a1);
  pvVar3 = (vw *)VW::config::typed_option<unsigned_long>::help
                           ((typed_option<unsigned_long> *)in_stack_fffffffffffff3c0,
                            (string *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8))
  ;
  funcName = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                       (in_stack_fffffffffffff410,
                        (typed_option<unsigned_long> *)in_stack_fffffffffffff408);
  paVar12 = &local_369;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"pool_greedy",paVar12);
  fVar13 = (float)((ulong)paVar12 >> 0x20);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
            ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39d00d);
  VW::config::make_option<bool>(in_stack_fffffffffffff3c8,(bool *)in_stack_fffffffffffff3c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"use greedy selection on mini pools",&local_391);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff3c0,
             (string *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff410,(typed_option<bool> *)in_stack_fffffffffffff408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"para_active",&local_459);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
            ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39d0dc);
  VW::config::make_option<bool>(in_stack_fffffffffffff3c8,(bool *)in_stack_fffffffffffff3c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"do parallel active learning",&local_481);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff3c0,
             (string *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff410,(typed_option<bool> *)in_stack_fffffffffffff408);
  paVar12 = &local_549;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"pool_size",paVar12);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
            ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39d1ab);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff3c8,(unsigned_long *)in_stack_fffffffffffff3c0);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
             (unsigned_long)in_stack_fffffffffffff3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"size of pools for active learning",&local_571);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff3c0,
             (string *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffff410,(typed_option<unsigned_long> *)in_stack_fffffffffffff408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_638,"subsample",&local_639);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
            ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39d296);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff3c8,(unsigned_long *)in_stack_fffffffffffff3c0);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
             (unsigned_long)in_stack_fffffffffffff3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_660,"number of items to subsample from the pool",&local_661);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff3c0,
             (string *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffff410,(typed_option<unsigned_long> *)in_stack_fffffffffffff408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_728,"kernel",&local_729);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff3c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_708,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_750,"linear",&local_751);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  default_value((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                in_stack_fffffffffffff3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_778,"type of kernel (rbf or linear (default))",&local_779);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffff3c0,
       (string *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"bandwidth",&local_841);
  VW::config::make_option<float>(in_stack_fffffffffffff3c8,(float *)in_stack_fffffffffffff3c0);
  VW::config::typed_option<float>::keep(&local_820,true);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
             (float)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_868,"bandwidth of rbf kernel",&local_869);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff3c0,
             (string *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff410,(typed_option<float> *)in_stack_fffffffffffff408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_930,"degree",&local_931);
  VW::config::make_option<int>(in_stack_fffffffffffff3c8,(int *)in_stack_fffffffffffff3c0);
  VW::config::typed_option<int>::keep(&local_910,true);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
             (int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_958,"degree of poly kernel",&local_959);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffff3c0,
             (string *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            (in_stack_fffffffffffff410,(typed_option<int> *)in_stack_fffffffffffff408);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator((allocator<char> *)&local_959);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff3c0);
  std::__cxx11::string::~string(local_930);
  std::allocator<char>::~allocator((allocator<char> *)&local_931);
  std::__cxx11::string::~string(local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff3c0);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  std::__cxx11::string::~string(local_778);
  std::allocator<char>::~allocator((allocator<char> *)&local_779);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffff3c0);
  std::__cxx11::string::~string(local_728);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff3c0);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator((allocator<char> *)&local_639);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff3c0);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff3c0);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff3c0);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff3c0);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff3c0);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  (**(code **)*local_10)(local_10,local_90);
  if ((local_51 & 1) == 0) {
    local_8 = (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
    local_960 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_980,"hinge",&local_981);
    std::allocator<char>::~allocator((allocator<char> *)&local_981);
    local_988 = 0;
    if (local_18->loss != (loss_function *)0x0) {
      (*local_18->loss->_vptr_loss_function[9])();
    }
    std::__cxx11::string::string(local_9a8,local_980);
    plVar4 = getLossFunction(pvVar3,&funcName->m_name,fVar13);
    local_18->loss = plVar4;
    std::__cxx11::string::~string(local_9a8);
    psVar5 = calloc_or_throw<svm_model>();
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e131);
    psVar6->model = psVar5;
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e14a);
    psVar6->model->num_support = 0;
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e162);
    psVar6->maxcache = 0x40000000;
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e177);
    pvVar3 = local_18;
    psVar6->loss_sum = 0.0;
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e19f);
    psVar6->all = pvVar3;
    if ((local_18->active & 1U) != 0) {
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e1cc);
      psVar6->active = true;
    }
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e244);
    if ((psVar6->active & 1U) != 0) {
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e257);
      psVar6->active_c = 1.0;
    }
    std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
              ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e271);
    ppsVar7 = calloc_or_throw<svm_example*>((size_t)paVar12);
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e299);
    psVar6->pool = ppsVar7;
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e2b2);
    psVar6->pool_pos = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_9c8,"subsample",&local_9c9);
    bVar1 = (**(code **)(*local_10 + 8))(local_10,local_9c8);
    local_ba2 = 0;
    if ((bVar1 & 1) == 0) {
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e343);
      local_ba2 = psVar6->para_active;
    }
    std::__cxx11::string::~string(local_9c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
    if ((local_ba2 & 1) != 0) {
      std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e392);
      _Var11 = std::ceil<unsigned_long>(0x39e3b3);
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e402);
      psVar6->subsample =
           (long)_Var11 | (long)(_Var11 - 9.223372036854776e+18) & (long)_Var11 >> 0x3f;
    }
    fVar13 = local_18->l2_lambda;
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e47f);
    psVar6->lambda = fVar13;
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e49a);
    if ((psVar6->lambda == 0.0) && (!NAN(psVar6->lambda))) {
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e4bb);
      psVar6->lambda = 1.0;
    }
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e4d5);
    poVar8 = std::operator<<(&(psVar6->all->trace_message).super_ostream,"Lambda = ");
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e506);
    pvVar9 = (void *)std::ostream::operator<<(poVar8,psVar6->lambda);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e53f);
    poVar8 = std::operator<<(&(psVar6->all->trace_message).super_ostream,"Kernel = ");
    poVar8 = std::operator<<(poVar8,local_48);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    iVar2 = std::__cxx11::string::compare((char *)local_48);
    if (iVar2 == 0) {
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e5bb);
      psVar6->kernel_type = 1;
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e5cd);
      poVar8 = std::operator<<(&(psVar6->all->trace_message).super_ostream,"bandwidth = ");
      pvVar9 = (void *)std::ostream::operator<<(poVar8,local_4c);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      pdVar10 = calloc_or_throw<double>();
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e634);
      fVar13 = local_4c;
      psVar6->kernel_params = pdVar10;
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e659);
      *(float *)psVar6->kernel_params = fVar13;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)local_48);
      if (iVar2 == 0) {
        psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                           ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e69b);
        psVar6->kernel_type = 2;
        psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                           ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e6ad);
        poVar8 = std::operator<<(&(psVar6->all->trace_message).super_ostream,"degree = ");
        in_stack_fffffffffffff3e0 =
             (learner<svm_params,_example> *)std::ostream::operator<<(poVar8,local_50);
        std::ostream::operator<<(in_stack_fffffffffffff3e0,std::endl<char,std::char_traits<char>>);
        in_stack_fffffffffffff3d8 = (_func_void_svm_params_ptr *)calloc_or_throw<int>();
        psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                           ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e712);
        psVar6->kernel_params = in_stack_fffffffffffff3d8;
        in_stack_fffffffffffff3d4 = local_50;
        psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                           ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e733);
        *(int *)psVar6->kernel_params = in_stack_fffffffffffff3d4;
      }
      else {
        psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                           ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e74c);
        psVar6->kernel_type = 0;
      }
    }
    std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
              ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x39e763);
    parameters::stride_shift((parameters *)in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc);
    this = LEARNER::init_learner<svm_params,example,LEARNER::learner<char,example>>
                     ((free_ptr<svm_params> *)
                      CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                      (_func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff3c8,
                      (_func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff3c0,
                      CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
    LEARNER::learner<svm_params,_example>::set_save_load(this,save_load);
    LEARNER::learner<svm_params,_example>::set_finish
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
    in_stack_fffffffffffff3c0 =
         (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)LEARNER::make_base<svm_params,example>(this);
    local_960 = 1;
    local_8 = in_stack_fffffffffffff3c0;
    std::__cxx11::string::~string(local_980);
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff3c0);
  std::__cxx11::string::~string(local_48);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<svm_params,_void_(*)(void_*)> *)
             CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0));
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner* kernel_svm_setup(options_i& options, vw& all)
{
  auto params = scoped_calloc_or_throw<svm_params>();
  std::string kernel_type;
  float bandwidth = 1.f;
  int degree = 2;

  bool ksvm = false;

  option_group_definition new_options("Kernel SVM");
  new_options.add(make_option("ksvm", ksvm).keep().help("kernel svm"))
      .add(make_option("reprocess", params->reprocess).default_value(1).help("number of reprocess steps for LASVM"))
      .add(make_option("pool_greedy", params->active_pool_greedy).help("use greedy selection on mini pools"))
      .add(make_option("para_active", params->para_active).help("do parallel active learning"))
      .add(make_option("pool_size", params->pool_size).default_value(1).help("size of pools for active learning"))
      .add(make_option("subsample", params->subsample)
               .default_value(1)
               .help("number of items to subsample from the pool"))
      .add(make_option("kernel", kernel_type)
               .keep()
               .default_value("linear")
               .help("type of kernel (rbf or linear (default))"))
      .add(make_option("bandwidth", bandwidth).keep().default_value(1.f).help("bandwidth of rbf kernel"))
      .add(make_option("degree", degree).keep().default_value(2).help("degree of poly kernel"));
  options.add_and_parse(new_options);

  if (!ksvm)
  {
    return nullptr;
  }

  string loss_function = "hinge";
  float loss_parameter = 0.0;
  delete all.loss;
  all.loss = getLossFunction(all, loss_function, (float)loss_parameter);

  params->model = &calloc_or_throw<svm_model>();
  params->model->num_support = 0;
  params->maxcache = 1024 * 1024 * 1024;
  params->loss_sum = 0.;
  params->all = &all;

  // This param comes from the active reduction.
  // During options refactor: this changes the semantics a bit - now this will only be true if --active was supplied and
  // NOT --simulation
  if (all.active)
    params->active = true;
  if (params->active)
    params->active_c = 1.;

  params->pool = calloc_or_throw<svm_example*>(params->pool_size);
  params->pool_pos = 0;

  if (!options.was_supplied("subsample") && params->para_active)
    params->subsample = (size_t)ceil(params->pool_size / all.all_reduce->total);

  params->lambda = all.l2_lambda;
  if (params->lambda == 0.)
    params->lambda = 1.;
  params->all->trace_message << "Lambda = " << params->lambda << endl;
  params->all->trace_message << "Kernel = " << kernel_type << endl;

  if (kernel_type.compare("rbf") == 0)
  {
    params->kernel_type = SVM_KER_RBF;
    params->all->trace_message << "bandwidth = " << bandwidth << endl;
    params->kernel_params = &calloc_or_throw<double>();
    *((float*)params->kernel_params) = bandwidth;
  }
  else if (kernel_type.compare("poly") == 0)
  {
    params->kernel_type = SVM_KER_POLY;
    params->all->trace_message << "degree = " << degree << endl;
    params->kernel_params = &calloc_or_throw<int>();
    *((int*)params->kernel_params) = degree;
  }
  else
    params->kernel_type = SVM_KER_LIN;

  params->all->weights.stride_shift(0);

  learner<svm_params, example>& l = init_learner(params, learn, predict, 1);
  l.set_save_load(save_load);
  l.set_finish(finish);
  return make_base(l);
}